

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<int&,int>(char *fmt,int *args,int *args_1)

{
  int *in_R8;
  string local_28;
  
  StringPrintf<int&,int>(&local_28,(pbrt *)fmt,(char *)args,args_1,in_R8);
  ErrorExit((FileLoc *)0x0,local_28._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}